

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc_test.c
# Opt level: O0

int LowMC_test_vector_192_192_4_1(void)

{
  int iVar1;
  uint8_t ciphertext_expected [24];
  uint8_t plaintext [24];
  uint8_t key [24];
  uint8_t *in_stack_ffffffffffffffe0;
  
  iVar1 = lowmc_enc((lowmc_parameters_t *)0x80,in_stack_ffffffffffffffe0,(uint8_t *)0x0,
                    (uint8_t *)0x0);
  return iVar1;
}

Assistant:

static int LowMC_test_vector_192_192_4_1(void) {
  const uint8_t key[24] = {
      0x80, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0,
      0x0,  0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0,
  };
  const uint8_t plaintext[24] = {
      0xab, 0xff, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0,
      0x0,  0x0,  0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0, 0x0,
  };
  const uint8_t ciphertext_expected[24] = {
      0xf8, 0xf7, 0xa2, 0x25, 0xde, 0x77, 0x12, 0x31, 0x29, 0x10, 0x7a, 0x20,
      0xf5, 0x54, 0x3a, 0xfa, 0x78, 0x33, 0x7,  0x66, 0x53, 0xba, 0x2b, 0x29,
  };
  return lowmc_enc(&parameters_192_192_4, key, plaintext, ciphertext_expected);
}